

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::RandomNormalStaticLayerParams::MergeFrom
          (RandomNormalStaticLayerParams *this,RandomNormalStaticLayerParams *from)

{
  ulong uVar1;
  LogMessage *other;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O3/mlmodel/format/NeuralNetwork.pb.cc"
               ,0xb673);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  google::protobuf::RepeatedField<unsigned_long>::MergeFrom(&this->outputshape_,&from->outputshape_)
  ;
  if (from->seed_ != 0) {
    this->seed_ = from->seed_;
  }
  if (from->mean_ != 0.0) {
    this->mean_ = from->mean_;
  }
  if (from->stddev_ != 0.0) {
    this->stddev_ = from->stddev_;
  }
  uVar1 = (from->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               (string *)((uVar1 & 0xfffffffffffffffc) + 8));
  }
  return;
}

Assistant:

void RandomNormalStaticLayerParams::MergeFrom(const RandomNormalStaticLayerParams& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.RandomNormalStaticLayerParams)
  GOOGLE_DCHECK_NE(&from, this);
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  outputshape_.MergeFrom(from.outputshape_);
  if (from._internal_seed() != 0) {
    _internal_set_seed(from._internal_seed());
  }
  static_assert(sizeof(uint32_t) == sizeof(float), "Code assumes uint32_t and float are the same size.");
  float tmp_mean = from._internal_mean();
  uint32_t raw_mean;
  memcpy(&raw_mean, &tmp_mean, sizeof(tmp_mean));
  if (raw_mean != 0) {
    _internal_set_mean(from._internal_mean());
  }
  static_assert(sizeof(uint32_t) == sizeof(float), "Code assumes uint32_t and float are the same size.");
  float tmp_stddev = from._internal_stddev();
  uint32_t raw_stddev;
  memcpy(&raw_stddev, &tmp_stddev, sizeof(tmp_stddev));
  if (raw_stddev != 0) {
    _internal_set_stddev(from._internal_stddev());
  }
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
}